

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O2

sat_solver * Pdr_ManNewSolver(sat_solver *pSat,Pdr_Man_t *p,int k,int fInit)

{
  Vec_Ptr_t *p_00;
  Aig_Man_t *pAVar1;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *pCVar4;
  Vec_Int_t *pVVar5;
  Aig_Obj_t *pObj;
  long lVar6;
  int nCapMin;
  int iVar7;
  
  if (pSat == (sat_solver *)0x0) {
    __assert_fail("pSat != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCnf.c"
                  ,0x1b5,"sat_solver *Pdr_ManNewSolver(sat_solver *, Pdr_Man_t *, int, int)");
  }
  if (p->pPars->fMonoCnf == 0) {
    if (p->pCnf2 == (Cnf_Dat_t *)0x0) {
      pCVar4 = Cnf_DeriveOtherWithMan(p->pCnfMan,p->pAig,0);
      p->pCnf2 = pCVar4;
      pVVar5 = (Vec_Int_t *)calloc((long)p->pAig->vObjs->nSize,0x10);
      p->pvId2Vars = pVVar5;
      Vec_PtrGrow(&p->vVar2Ids,0x100);
    }
    p_00 = &p->vVar2Ids;
    iVar7 = (p->vVar2Ids).nSize;
    if (iVar7 <= k) {
      iVar2 = k + 1;
      iVar3 = p_00->nCap * 2;
      nCapMin = iVar2;
      if ((iVar3 <= k) || (nCapMin = iVar3, p_00->nCap <= k)) {
        Vec_PtrGrow(p_00,nCapMin);
        iVar7 = (p->vVar2Ids).nSize;
      }
      for (lVar6 = (long)iVar7; lVar6 < iVar2; lVar6 = lVar6 + 1) {
        (p->vVar2Ids).pArray[lVar6] = (void *)0x0;
      }
      (p->vVar2Ids).nSize = iVar2;
    }
    pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p_00,k);
    if (pVVar5 == (Vec_Int_t *)0x0) {
      pVVar5 = Vec_IntAlloc(500);
      if ((k < 0) || ((p->vVar2Ids).nSize <= k)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      (p->vVar2Ids).pArray[(uint)k] = pVVar5;
    }
    for (iVar7 = 0; iVar7 < pVVar5->nSize; iVar7 = iVar7 + 1) {
      iVar2 = Vec_IntEntry(pVVar5,iVar7);
      if (iVar2 != -1) {
        iVar3 = Vec_IntEntry(p->pvId2Vars + iVar2,k);
        if (iVar3 < 1) {
          __assert_fail("Vec_IntEntry( p->pvId2Vars + Entry, k ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCnf.c"
                        ,0x19c,"sat_solver *Pdr_ManNewSolver2(sat_solver *, Pdr_Man_t *, int, int)")
          ;
        }
        Vec_IntWriteEntry(p->pvId2Vars + iVar2,k,0);
      }
    }
    pVVar5->nSize = 0;
    Vec_IntPush(pVVar5,-1);
    sat_solver_setnvars(pSat,500);
  }
  else {
    pCVar4 = p->pCnf1;
    if (pCVar4 == (Cnf_Dat_t *)0x0) {
      pAVar1 = p->pAig;
      iVar7 = pAVar1->nRegs;
      iVar2 = pAVar1->nObjs[3];
      pAVar1->nRegs = iVar2;
      pCVar4 = Cnf_DeriveWithMan(p->pCnfMan,pAVar1,iVar2);
      p->pCnf1 = pCVar4;
      p->pAig->nRegs = iVar7;
      if (p->vVar2Reg != (Vec_Int_t *)0x0) {
        __assert_fail("p->vVar2Reg == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCnf.c"
                      ,0x16e,"sat_solver *Pdr_ManNewSolver1(sat_solver *, Pdr_Man_t *, int, int)");
      }
      iVar7 = pCVar4->nVars;
      pVVar5 = Vec_IntAlloc(iVar7);
      pVVar5->nSize = iVar7;
      memset(pVVar5->pArray,0xff,(long)iVar7 << 2);
      p->vVar2Reg = pVVar5;
      for (iVar7 = 0; pAVar1 = p->pAig, iVar7 < pAVar1->nRegs; iVar7 = iVar7 + 1) {
        pObj = (Aig_Obj_t *)Vec_PtrEntry(pAVar1->vCos,pAVar1->nTruePos + iVar7);
        pVVar5 = p->vVar2Reg;
        iVar2 = Pdr_ObjSatVar(p,k,3,pObj);
        Vec_IntWriteEntry(pVVar5,iVar2,iVar7);
      }
      pCVar4 = p->pCnf1;
    }
    pSat = (sat_solver *)Cnf_DataWriteIntoSolverInt(pSat,pCVar4,1,fInit);
  }
  pSat->nRuntimeLimit = p->timeToStop;
  return pSat;
}

Assistant:

sat_solver * Pdr_ManNewSolver( sat_solver * pSat, Pdr_Man_t * p, int k, int fInit )
{
    assert( pSat != NULL );
    if ( p->pPars->fMonoCnf )
        return Pdr_ManNewSolver1( pSat, p, k, fInit );
    else
        return Pdr_ManNewSolver2( pSat, p, k, fInit );
}